

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.cc
# Opt level: O2

void __thiscall google::protobuf::strings::ArrayByteSource::Skip(ArrayByteSource *this,size_t n)

{
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if ((ulong)(this->input_).length_ < n) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,"third_party/protobuf-lite/bytestream.cc",0x9d);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (n) <= (input_.size()): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  StringPiece::remove_prefix(&this->input_,n);
  return;
}

Assistant:

void ArrayByteSource::Skip(size_t n) {
  GOOGLE_DCHECK_LE(n, input_.size());
  input_.remove_prefix(n);
}